

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<2,_151>::
BreitWignerReichMooreBase<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore>
::BreitWignerReichMooreBase
          (BreitWignerReichMooreBase<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_njoy::ENDFtk::section::Type<2,_151>::ReichMoore>
           *this,double spi,double ap,bool lad,int nlsc,
          vector<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
          *lvalues)

{
  pointer pRVar1;
  
  this->spi_ = spi;
  this->ap_ = ap;
  this->lad_ = lad;
  this->nlsc_ = nlsc;
  pRVar1 = (lvalues->
           super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->lvalues_).
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (lvalues->
       super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->lvalues_).
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = pRVar1;
  (this->lvalues_).
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (lvalues->
       super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (lvalues->
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (lvalues->
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (lvalues->
  super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  verifySize((int)(((long)(this->lvalues_).
                          super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->lvalues_).
                         super__Vector_base<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue,_std::allocator<njoy::ENDFtk::section::Type<2,_151>::ReichMooreLValue>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x48));
  return;
}

Assistant:

BreitWignerReichMooreBase( double spi, double ap, bool lad, int nlsc,
                           std::vector< LValue >&& lvalues ) :
    // no need for a try ... catch: nothing can go wrong here
    spi_( spi ), ap_( ap ), lad_( lad ), nlsc_( nlsc ),
    lvalues_( std::move( lvalues ) ) {

      verifySize( this->NLS() );
    }